

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_opl_mididevice.cpp
# Opt level: O0

void __thiscall OPLMIDIDevice::HandleEvent(OPLMIDIDevice *this,int status,int parm1,int parm2)

{
  uint uVar1;
  uint local_24;
  int channel;
  int command;
  int parm2_local;
  int parm1_local;
  int status_local;
  OPLMIDIDevice *this_local;
  
  uVar1 = status & 0xf0;
  local_24 = status & 0xf;
  if (local_24 == 9) {
    local_24 = 0xf;
  }
  else if (local_24 == 0xf) {
    local_24 = 9;
  }
  if (uVar1 == 0x80) {
    (this->super_OPLmusicBlock).super_musicBlock.playingcount =
         (this->super_OPLmusicBlock).super_musicBlock.playingcount + -1;
    musicBlock::OPLreleaseNote(&(this->super_OPLmusicBlock).super_musicBlock,local_24,(uchar)parm1);
  }
  else if (uVar1 == 0x90) {
    (this->super_OPLmusicBlock).super_musicBlock.playingcount =
         (this->super_OPLmusicBlock).super_musicBlock.playingcount + 1;
    musicBlock::OPLplayNote
              (&(this->super_OPLmusicBlock).super_musicBlock,local_24,(uchar)parm1,parm2);
  }
  else if (uVar1 != 0xa0) {
    if (uVar1 == 0xb0) {
      switch(parm1) {
      case 0:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x01',parm2);
        break;
      case 1:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x02',parm2);
        break;
      default:
        break;
      case 6:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x0e',parm2);
        break;
      case 7:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x03',parm2);
        break;
      case 10:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x04',parm2);
        break;
      case 0xb:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x05',parm2);
        break;
      case 0x26:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x0f',parm2);
        break;
      case 0x40:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\b',parm2);
        break;
      case 0x43:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\t',parm2);
        break;
      case 0x5b:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x06',parm2);
        break;
      case 0x5d:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\a',parm2);
        break;
      case 0x62:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\r',parm2);
        break;
      case 99:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\f',parm2);
        break;
      case 100:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\v',parm2);
        break;
      case 0x65:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\n',parm2);
        break;
      case 0x78:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x10',parm2);
        break;
      case 0x79:
        musicBlock::OPLresetControllers(&(this->super_OPLmusicBlock).super_musicBlock,local_24,100);
        break;
      case 0x7b:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x11',parm2);
        break;
      case 0x7e:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x12',parm2);
        break;
      case 0x7f:
        musicBlock::OPLchangeControl
                  (&(this->super_OPLmusicBlock).super_musicBlock,local_24,'\x13',parm2);
      }
    }
    else if (uVar1 == 0xc0) {
      musicBlock::OPLprogramChange(&(this->super_OPLmusicBlock).super_musicBlock,local_24,parm1);
    }
    else if ((uVar1 != 0xd0) && (uVar1 == 0xe0)) {
      musicBlock::OPLpitchWheel
                (&(this->super_OPLmusicBlock).super_musicBlock,local_24,parm1 | parm2 << 7);
    }
  }
  return;
}

Assistant:

void OPLMIDIDevice::HandleEvent(int status, int parm1, int parm2)
{
	int command = status & 0xF0;
	int channel = status & 0x0F;

	// Swap channels 9 and 15, because their roles are reversed
	// in MUS and MIDI formats.
	if (channel == 9)
	{
		channel = 15;
	}
	else if (channel == 15)
	{
		channel = 9;
	}

	switch (command)
	{
	case MIDI_NOTEOFF:
		playingcount--;
		OPLreleaseNote(channel, parm1);
		break;

	case MIDI_NOTEON:
		playingcount++;
		OPLplayNote(channel, parm1, parm2);
		break;

	case MIDI_POLYPRESS:
		DEBUGOUT("Unhandled note aftertouch: Channel %d, note %d, value %d\n", channel, parm1, parm2);
		break;

	case MIDI_CTRLCHANGE:
		switch (parm1)
		{
		case 0:		OPLchangeControl(channel, ctrlBank, parm2);			break;
		case 1:		OPLchangeControl(channel, ctrlModulation, parm2);	break;
		case 6:		OPLchangeControl(channel, ctrlDataEntryHi, parm2);	break;
		case 7:		OPLchangeControl(channel, ctrlVolume, parm2);		break;
		case 10:	OPLchangeControl(channel, ctrlPan, parm2);			break;
		case 11:	OPLchangeControl(channel, ctrlExpression, parm2);	break;
		case 38:	OPLchangeControl(channel, ctrlDataEntryLo, parm2);	break;
		case 64:	OPLchangeControl(channel, ctrlSustainPedal, parm2);	break;
		case 67:	OPLchangeControl(channel, ctrlSoftPedal, parm2);	break;
		case 91:	OPLchangeControl(channel, ctrlReverb, parm2);		break;
		case 93:	OPLchangeControl(channel, ctrlChorus, parm2);		break;
		case 98:	OPLchangeControl(channel, ctrlNRPNLo, parm2);		break;
		case 99:	OPLchangeControl(channel, ctrlNRPNHi, parm2);		break;
		case 100:	OPLchangeControl(channel, ctrlRPNLo, parm2);		break;
		case 101:	OPLchangeControl(channel, ctrlRPNHi, parm2);		break;
		case 120:	OPLchangeControl(channel, ctrlSoundsOff, parm2);	break;
		case 121:	OPLresetControllers(channel, 100);					break;
		case 123:	OPLchangeControl(channel, ctrlNotesOff, parm2);		break;
		case 126:	OPLchangeControl(channel, ctrlMono, parm2);			break;
		case 127:	OPLchangeControl(channel, ctrlPoly, parm2);			break;
		default:
			DEBUGOUT("Unhandled controller: Channel %d, controller %d, value %d\n", channel, parm1, parm2);
			break;
		}
		break;

	case MIDI_PRGMCHANGE:
		OPLprogramChange(channel, parm1);
		break;

	case MIDI_CHANPRESS:
		DEBUGOUT("Unhandled channel aftertouch: Channel %d, value %d\n", channel, parm1, 0);
		break;

	case MIDI_PITCHBEND:
		OPLpitchWheel(channel, parm1 | (parm2 << 7));
		break;
	}
}